

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageProcessingQCOM(ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  int iVar2;
  int ref_idx_2;
  int tgt_idx_2;
  int ref_idx_1;
  int tgt_idx_1;
  int ref_idx;
  int tgt_idx;
  int wi_idx;
  Op opcode;
  spv_result_t res;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  wi_idx = 0;
  OVar1 = val::Instruction::opcode(inst);
  switch(OVar1) {
  case OpImageSampleWeightedQCOM:
    iVar2 = val::Instruction::GetOperandAs<int>(inst,4);
    wi_idx = ValidateImageProcessingQCOMDecoration(_,iVar2,DecorationWeightTextureQCOM);
    break;
  default:
    break;
  case OpImageBlockMatchSSDQCOM:
  case OpImageBlockMatchSADQCOM:
    iVar2 = val::Instruction::GetOperandAs<int>(inst,2);
    wi_idx = ValidateImageProcessingQCOMDecoration(_,iVar2,BlockMatchTextureQCOM);
    if (wi_idx == SPV_SUCCESS) {
      iVar2 = val::Instruction::GetOperandAs<int>(inst,4);
      wi_idx = ValidateImageProcessingQCOMDecoration(_,iVar2,BlockMatchTextureQCOM);
    }
    break;
  case OpImageBlockMatchWindowSSDQCOM:
  case OpImageBlockMatchWindowSADQCOM:
    iVar2 = val::Instruction::GetOperandAs<int>(inst,2);
    wi_idx = ValidateImageProcessing2QCOMWindowDecoration(_,iVar2);
    if (wi_idx == SPV_SUCCESS) {
      iVar2 = val::Instruction::GetOperandAs<int>(inst,4);
      wi_idx = ValidateImageProcessing2QCOMWindowDecoration(_,iVar2);
    }
    break;
  case OpImageBlockMatchGatherSSDQCOM:
  case OpImageBlockMatchGatherSADQCOM:
    iVar2 = val::Instruction::GetOperandAs<int>(inst,2);
    wi_idx = ValidateImageProcessingQCOMDecoration(_,iVar2,BlockMatchTextureQCOM);
    if (wi_idx == SPV_SUCCESS) {
      iVar2 = val::Instruction::GetOperandAs<int>(inst,4);
      wi_idx = ValidateImageProcessingQCOMDecoration(_,iVar2,BlockMatchTextureQCOM);
    }
  }
  return wi_idx;
}

Assistant:

spv_result_t ValidateImageProcessingQCOM(ValidationState_t& _,
                                         const Instruction* inst) {
  spv_result_t res = SPV_SUCCESS;
  const spv::Op opcode = inst->opcode();
  switch (opcode) {
    case spv::Op::OpImageSampleWeightedQCOM: {
      int wi_idx = inst->GetOperandAs<int>(4);  // weight
      res = ValidateImageProcessingQCOMDecoration(
          _, wi_idx, spv::Decoration::WeightTextureQCOM);
      break;
    }
    case spv::Op::OpImageBlockMatchSSDQCOM:
    case spv::Op::OpImageBlockMatchSADQCOM: {
      int tgt_idx = inst->GetOperandAs<int>(2);  // target
      res = ValidateImageProcessingQCOMDecoration(
          _, tgt_idx, spv::Decoration::BlockMatchTextureQCOM);
      if (res != SPV_SUCCESS) break;
      int ref_idx = inst->GetOperandAs<int>(4);  // reference
      res = ValidateImageProcessingQCOMDecoration(
          _, ref_idx, spv::Decoration::BlockMatchTextureQCOM);
      break;
    }
    case spv::Op::OpImageBlockMatchWindowSSDQCOM:
    case spv::Op::OpImageBlockMatchWindowSADQCOM: {
      int tgt_idx = inst->GetOperandAs<int>(2);  // target
      res = ValidateImageProcessing2QCOMWindowDecoration(_, tgt_idx);
      if (res != SPV_SUCCESS) break;
      int ref_idx = inst->GetOperandAs<int>(4);  // reference
      res = ValidateImageProcessing2QCOMWindowDecoration(_, ref_idx);
      break;
    }
    case spv::Op::OpImageBlockMatchGatherSSDQCOM:
    case spv::Op::OpImageBlockMatchGatherSADQCOM: {
      int tgt_idx = inst->GetOperandAs<int>(2);  // target
      res = ValidateImageProcessingQCOMDecoration(
          _, tgt_idx, spv::Decoration::BlockMatchTextureQCOM);
      if (res != SPV_SUCCESS) break;
      int ref_idx = inst->GetOperandAs<int>(4);  // reference
      res = ValidateImageProcessingQCOMDecoration(
          _, ref_idx, spv::Decoration::BlockMatchTextureQCOM);
      break;
    }
    default:
      break;
  }

  return res;
}